

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser_error parse_profile_params(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  cave_profile *c;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"block");
    *(wchar_t *)((long)pvVar2 + 0x18) = wVar1;
    wVar1 = parser_getint(p,"rooms");
    *(wchar_t *)((long)pvVar2 + 0x1c) = wVar1;
    wVar1 = parser_getint(p,"unusual");
    *(wchar_t *)((long)pvVar2 + 0x20) = wVar1;
    wVar1 = parser_getint(p,"rarity");
    *(wchar_t *)((long)pvVar2 + 0x24) = wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_profile_params(struct parser *p) {
	struct cave_profile *c = parser_priv(p);

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	c->block_size = parser_getint(p, "block");
	c->dun_rooms = parser_getint(p, "rooms");
	c->dun_unusual = parser_getint(p, "unusual");
	c->max_rarity = parser_getint(p, "rarity");
	return PARSE_ERROR_NONE;
}